

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinExport::WriteBinaryNodeAnim(AssbinExport *this,IOStream *container,aiNodeAnim *nd)

{
  uint uVar1;
  ulong uVar2;
  aiQuatKey *in;
  aiVectorKey *paVar3;
  uint32_t t;
  AssbinChunkWriter chunk;
  aiAnimBehaviour local_64;
  AssbinChunkWriter local_60;
  
  local_60.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0082be60;
  local_60.buffer = (uint8_t *)0x0;
  local_60.magic = 0x1238;
  local_60.cur_size = 0;
  local_60.cursor = 0;
  local_60.initial = 0x1000;
  uVar1 = (nd->mNodeName).length;
  local_60.container = container;
  AssbinChunkWriter::Grow(&local_60,4);
  *(ai_uint32 *)(local_60.buffer + local_60.cursor) = (nd->mNodeName).length;
  local_60.cursor = local_60.cursor + 4;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,(nd->mNodeName).data,(ulong)uVar1,1);
  local_64 = nd->mNumPositionKeys;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = nd->mNumRotationKeys;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = nd->mNumScalingKeys;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = nd->mPreState;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = nd->mPostState;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  paVar3 = nd->mPositionKeys;
  if (paVar3 != (aiVectorKey *)0x0) {
    uVar2 = (ulong)nd->mNumPositionKeys;
    if (this->shortened == true) {
      WriteBounds<aiVectorKey>(&local_60.super_IOStream,paVar3,nd->mNumPositionKeys);
    }
    else if (uVar2 != 0) {
      do {
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,paVar3,8,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&paVar3->mValue,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(paVar3->mValue).y,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(paVar3->mValue).z,4,1);
        paVar3 = paVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  in = nd->mRotationKeys;
  if (in != (aiQuatKey *)0x0) {
    uVar2 = (ulong)nd->mNumRotationKeys;
    if (this->shortened == true) {
      WriteBounds<aiQuatKey>(&local_60.super_IOStream,in,nd->mNumRotationKeys);
    }
    else if (uVar2 != 0) {
      do {
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,in,8,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&in->mValue,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(in->mValue).x,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(in->mValue).y,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(in->mValue).z,4,1);
        in = in + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  paVar3 = nd->mScalingKeys;
  if (paVar3 != (aiVectorKey *)0x0) {
    uVar2 = (ulong)nd->mNumScalingKeys;
    if (this->shortened == true) {
      WriteBounds<aiVectorKey>(&local_60.super_IOStream,paVar3,nd->mNumScalingKeys);
    }
    else if (uVar2 != 0) {
      do {
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,paVar3,8,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&paVar3->mValue,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(paVar3->mValue).y,4,1);
        (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&(paVar3->mValue).z,4,1);
        paVar3 = paVar3 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_60);
  return;
}

Assistant:

void WriteBinaryNodeAnim(IOStream * container, const aiNodeAnim* nd)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODEANIM );

        Write<aiString>(&chunk,nd->mNodeName);
        Write<unsigned int>(&chunk,nd->mNumPositionKeys);
        Write<unsigned int>(&chunk,nd->mNumRotationKeys);
        Write<unsigned int>(&chunk,nd->mNumScalingKeys);
        Write<unsigned int>(&chunk,nd->mPreState);
        Write<unsigned int>(&chunk,nd->mPostState);

        if (nd->mPositionKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);
        }
        if (nd->mRotationKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);

            } // else write as usual
            else WriteArray<aiQuatKey>(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);
        }
        if (nd->mScalingKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);
        }
    }